

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O3

libcaption_stauts_t sei_to_caption_frame(sei_t *sei,caption_frame_t *frame)

{
  libcaption_stauts_t lVar1;
  libcaption_stauts_t lVar2;
  libcaption_stauts_t lVar3;
  _sei_message_t *p_Var4;
  cea708_t cea708;
  cea708_t cStack_c8;
  
  cea708_init(&cStack_c8,frame->timestamp);
  p_Var4 = sei->head;
  lVar3 = LIBCAPTION_OK;
  if (p_Var4 != (sei_message_t *)0x0) {
    do {
      if (p_Var4->type == sei_type_user_data_registered_itu_t_t35) {
        cea708_parse_h264((uint8_t *)(p_Var4 + 1),p_Var4->size,&cStack_c8);
        lVar1 = cea708_to_caption_frame(frame,&cStack_c8);
        lVar2 = lVar1;
        if (lVar3 == LIBCAPTION_READY) {
          lVar2 = lVar3;
        }
        if (lVar1 == LIBCAPTION_ERROR) {
          lVar2 = lVar1;
        }
        if (lVar3 != LIBCAPTION_ERROR) {
          lVar3 = lVar2;
        }
      }
      p_Var4 = p_Var4->next;
    } while (p_Var4 != (_sei_message_t *)0x0);
    if (lVar3 == LIBCAPTION_READY) {
      frame->timestamp = sei->timestamp;
      lVar3 = LIBCAPTION_READY;
    }
  }
  return lVar3;
}

Assistant:

libcaption_stauts_t sei_to_caption_frame(sei_t* sei, caption_frame_t* frame)
{
    cea708_t cea708;
    sei_message_t* msg;
    libcaption_stauts_t status = LIBCAPTION_OK;

    cea708_init(&cea708, frame->timestamp);

    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
            cea708_parse_h264(sei_message_data(msg), sei_message_size(msg), &cea708);
            status = libcaption_status_update(status, cea708_to_caption_frame(frame, &cea708));
        }
    }

    if (LIBCAPTION_READY == status) {
        frame->timestamp = sei->timestamp;
    }

    return status;
}